

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86IntelInstPrinter.c
# Opt level: O3

void X86_Intel_printInst(MCInst *MI,SStream *O,void *Info)

{
  uint8_t *puVar1;
  char cVar2;
  byte bVar3;
  cs_detail *pcVar4;
  _Bool _Var5;
  uint uVar6;
  uint uVar7;
  x86_reg xVar8;
  undefined8 in_RAX;
  MCOperand *pMVar9;
  int64_t iVar10;
  MCRegisterClass *c;
  char *s;
  ulong uVar11;
  SStream *extraout_RDX;
  SStream *extraout_RDX_00;
  SStream *extraout_RDX_01;
  SStream *extraout_RDX_02;
  SStream *extraout_RDX_03;
  SStream *extraout_RDX_04;
  SStream *pSVar12;
  uint8_t uVar13;
  uint uVar14;
  int reg_00;
  x86_avx_bcast v;
  char *pcVar15;
  char *pcVar16;
  ulong uVar17;
  x86_reg reg2;
  x86_reg reg;
  undefined8 local_38;
  
  local_38 = in_RAX;
  uVar6 = MCInst_getOpcode(MI);
  if ((int)uVar6 < 0x269) {
    if (uVar6 == 0x15) {
      uVar6 = MCInst_getNumOperands(MI);
      if (uVar6 == 1) {
        pMVar9 = MCInst_getOperand(MI,0);
        _Var5 = MCOperand_isImm(pMVar9);
        if (_Var5) {
          pMVar9 = MCInst_getOperand(MI,0);
          iVar10 = MCOperand_getImm(pMVar9);
          if (iVar10 == 10) {
            pcVar15 = "aad";
            goto LAB_001a233b;
          }
        }
      }
    }
    else if (uVar6 == 0x16) {
      uVar6 = MCInst_getNumOperands(MI);
      if (uVar6 == 1) {
        pMVar9 = MCInst_getOperand(MI,0);
        _Var5 = MCOperand_isImm(pMVar9);
        if (_Var5) {
          pMVar9 = MCInst_getOperand(MI,0);
          iVar10 = MCOperand_getImm(pMVar9);
          if (iVar10 == 10) {
            pcVar15 = "aam";
            goto LAB_001a233b;
          }
        }
      }
    }
  }
  else if (uVar6 == 0x269) {
    uVar6 = MCInst_getNumOperands(MI);
    if (uVar6 == 6) {
      pMVar9 = MCInst_getOperand(MI,0);
      _Var5 = MCOperand_isReg(pMVar9);
      if (_Var5) {
        c = MCRegisterInfo_getRegClass((MCRegisterInfo *)Info,0x2a);
        pMVar9 = MCInst_getOperand(MI,0);
        uVar6 = MCOperand_getReg(pMVar9);
        _Var5 = MCRegisterClass_contains(c,uVar6);
        if (_Var5) {
          pcVar15 = anon_var_dwarf_ea3a2;
          goto LAB_001a233b;
        }
      }
    }
  }
  else if (uVar6 == 0x1879) {
    uVar6 = MCInst_getNumOperands(MI);
    if (uVar6 == 0) {
      pcVar15 = "xstorerng";
LAB_001a233b:
      s = cs_strdup(pcVar15);
      for (pcVar15 = s; cVar2 = *pcVar15, cVar2 != '\0'; pcVar15 = pcVar15 + 1) {
        if ((cVar2 == ' ') || (cVar2 == '\t')) {
          *pcVar15 = '\0';
          pcVar15 = pcVar15 + 1;
          break;
        }
      }
      SStream_concat0(O,s);
      if (*pcVar15 != '\0') {
        SStream_concat0(O,anon_var_dwarf_73cc4 + 0x11);
        do {
          cVar2 = *pcVar15;
          if (cVar2 == '$') {
            if (pcVar15[1] == -1) {
              pcVar16 = pcVar15 + 3;
              if (pcVar15[3] == '\x01') {
                cVar2 = pcVar15[2];
                SStream_concat0(O,"qword ptr ");
                MI->x86opsize = '\b';
                printMemReference(MI,(int)cVar2 - 1,O);
              }
            }
            else {
              pcVar16 = pcVar15 + 1;
              printOperand(MI,(int)pcVar15[1] - 1,O);
            }
          }
          else {
            if (cVar2 == '\0') break;
            SStream_concat(O,"%c",(ulong)(uint)(int)cVar2);
            pcVar16 = pcVar15;
          }
          pcVar15 = pcVar16 + 1;
        } while( true );
      }
      if (s != (char *)0x0) {
        (*cs_mem_free)(s);
        goto switchD_001a2493_default;
      }
    }
  }
  uVar7 = MCInst_getOpcode(MI);
  uVar6 = *(uint *)(printInstruction_OpInfo + (ulong)uVar7 * 4);
  uVar7 = *(uint *)(printInstruction_OpInfo2 + (ulong)uVar7 * 4);
  _Var5 = X86_lockrep(MI,O);
  if (!_Var5) {
    SStream_concat0(O,(char *)((ulong)(uVar6 & 0x3fff) + 0x32f05f));
  }
  switch(uVar6 >> 0xe & 0x3f) {
  case 1:
    uVar14 = 0;
    goto LAB_001a2668;
  case 2:
    MI->x86opsize = '\x02';
    pcVar15 = "word ptr ";
    goto LAB_001a2683;
  case 3:
    uVar14 = 1;
LAB_001a2668:
    printOperand(MI,uVar14,O);
    goto LAB_001a28fa;
  case 4:
    MI->x86opsize = '\x04';
    pcVar15 = "dword ptr ";
LAB_001a2683:
    SStream_concat0(O,pcVar15);
    break;
  case 5:
  case 8:
    SStream_concat0(O,"qword ptr ");
    MI->x86opsize = '\b';
    break;
  case 6:
    SStream_concat0(O,"byte ptr ");
    MI->x86opsize = '\x01';
    break;
  case 7:
    SStream_concat0(O,"dword ptr ");
    MI->x86opsize = '\x04';
    break;
  case 9:
    pMVar9 = MCInst_getOperand(MI,0);
    _Var5 = MCOperand_isImm(pMVar9);
    if (_Var5) {
      iVar10 = MCOperand_getImm(pMVar9);
      uVar17 = (ulong)MI->flat_insn->size + iVar10 + MI->address;
      if ((long)uVar17 < 0) {
LAB_001a27ef:
        pcVar15 = " + 0x%lx";
      }
      else {
        uVar11 = uVar17 - 0x10000;
        if (MI->csh->mode != CS_MODE_16) {
          uVar11 = uVar17;
        }
        if (0x100000 < uVar17) {
          uVar17 = uVar11;
        }
        if (9 < (long)uVar17) goto LAB_001a27ef;
        pcVar15 = " + %lu";
      }
      SStream_concat(O,pcVar15 + 3,uVar17);
      if (MI->csh->detail != CS_OPT_OFF) {
        pcVar4 = MI->flat_insn->detail;
        puVar1 = pcVar4->groups + (ulong)((uint)(pcVar4->field_6).x86.op_count * 0x30) + 0x3e;
        puVar1[0] = '\x02';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        pcVar4 = MI->flat_insn->detail;
        bVar3 = (pcVar4->field_6).x86.op_count;
        if (bVar3 == 0) {
          *(uint8_t *)((long)&pcVar4->field_6 + 0x50) = MI->imm_size;
        }
        else {
          pcVar4->groups[(ulong)((uint)bVar3 * 0x30) + 0x5e] =
               *(uint8_t *)((long)&pcVar4->field_6 + 0x50);
        }
        pcVar4 = MI->flat_insn->detail;
        *(ulong *)(pcVar4->groups + (ulong)((uint)(pcVar4->field_6).x86.op_count * 0x30) + 0x46) =
             uVar17;
        puVar1 = &(MI->flat_insn->detail->field_6).x86.op_count;
        *puVar1 = *puVar1 + '\x01';
      }
      if (MI->op1_size == '\0') {
        MI->op1_size = MI->imm_size;
      }
    }
    goto LAB_001a28fa;
  case 10:
    uVar14 = 7;
    goto LAB_001a277a;
  case 0xb:
    uVar14 = 3;
LAB_001a277a:
    printSSECC(MI,uVar14,O);
    goto LAB_001a28fa;
  case 0xc:
    pcVar15 = "byte ptr ";
    SStream_concat0(O,"byte ptr ");
    uVar13 = '\x01';
    goto LAB_001a26e5;
  case 0xd:
    pcVar15 = "dword ptr ";
    SStream_concat0(O,"dword ptr ");
    uVar13 = '\x04';
    goto LAB_001a26e5;
  case 0xe:
    pcVar15 = "qword ptr ";
    SStream_concat0(O,"qword ptr ");
    uVar13 = '\b';
    goto LAB_001a26e5;
  case 0xf:
    pcVar15 = "word ptr ";
    SStream_concat0(O,"word ptr ");
    uVar13 = '\x02';
LAB_001a26e5:
    MI->x86opsize = uVar13;
    printSrcIdx(MI,1,O);
    SStream_concat0(O,", ");
    SStream_concat0(O,pcVar15);
    MI->x86opsize = uVar13;
    printDstIdx(MI,0,O);
    goto switchD_001a2493_default;
  case 0x10:
  case 0x24:
    SStream_concat0(O,"xmmword ptr ");
    MI->x86opsize = '\x10';
    break;
  case 0x11:
    uVar6 = 0;
    goto LAB_001a2d44;
  case 0x12:
    SStream_concat0(O,"byte ptr ");
    MI->x86opsize = '\x01';
    goto LAB_001a28ed;
  case 0x13:
    SStream_concat0(O,"dword ptr ");
    MI->x86opsize = '\x04';
    goto LAB_001a28ed;
  case 0x14:
    SStream_concat0(O,"word ptr ");
    MI->x86opsize = '\x02';
    goto LAB_001a28ed;
  case 0x15:
    uVar14 = 7;
    goto LAB_001a2869;
  case 0x16:
    uVar14 = 3;
LAB_001a2869:
    printAVXCC(MI,uVar14,O);
    goto LAB_001a28fa;
  case 0x17:
    SStream_concat0(O,"xword ptr ");
    MI->x86opsize = '\n';
    uVar6 = 0;
    goto LAB_001a2f43;
  case 0x18:
    SStream_concat0(O,"byte ptr ");
    MI->x86opsize = '\x01';
    goto LAB_001a2b96;
  case 0x19:
    SStream_concat0(O,"dword ptr ");
    MI->x86opsize = '\x04';
    goto LAB_001a2b96;
  case 0x1a:
    SStream_concat0(O,"qword ptr ");
    MI->x86opsize = '\b';
    goto LAB_001a2b96;
  case 0x1b:
    SStream_concat0(O,"word ptr ");
    MI->x86opsize = '\x02';
LAB_001a2b96:
    printSrcIdx(MI,0,O);
    goto switchD_001a2493_default;
  case 0x1c:
    MI->x86opsize = '\x02';
    pcVar15 = "word ptr ";
    goto LAB_001a2b44;
  case 0x1d:
    MI->x86opsize = '\x04';
    pcVar15 = "dword ptr ";
LAB_001a2b44:
    SStream_concat0(O,pcVar15);
    goto LAB_001a2b4c;
  case 0x1e:
    SStream_concat0(O,"qword ptr ");
    MI->x86opsize = '\b';
    goto LAB_001a2b4c;
  case 0x1f:
    SStream_concat0(O,"byte ptr ");
    MI->x86opsize = '\x01';
LAB_001a2b4c:
    printMemReference(MI,2,O);
LAB_001a2b5c:
    SStream_concat0(O,", ");
    uVar6 = 1;
    goto LAB_001a2b73;
  case 0x20:
    SStream_concat0(O,"word ptr ");
    MI->x86opsize = '\x02';
    pSVar12 = extraout_RDX_02;
    goto LAB_001a2851;
  case 0x21:
    SStream_concat0(O,"dword ptr ");
    MI->x86opsize = '\x04';
    pSVar12 = extraout_RDX_01;
    goto LAB_001a2851;
  case 0x22:
    SStream_concat0(O,"qword ptr ");
    MI->x86opsize = '\b';
    pSVar12 = extraout_RDX_00;
    goto LAB_001a2851;
  case 0x23:
    SStream_concat0(O,"byte ptr ");
    MI->x86opsize = '\x01';
    pSVar12 = extraout_RDX;
LAB_001a2851:
    printMemOffset(MI,(uint)O,pSVar12);
    goto LAB_001a28fa;
  case 0x25:
    SStream_concat0(O,"qword ptr ");
    MI->x86opsize = '\b';
LAB_001a28ed:
    printDstIdx(MI,0,O);
    goto LAB_001a28fa;
  case 0x26:
  case 0x27:
    SStream_concat0(O,"ymmword ptr ");
    MI->x86opsize = ' ';
    break;
  case 0x28:
  case 0x29:
    SStream_concat0(O,"zmmword ptr ");
    MI->x86opsize = '@';
    break;
  case 0x2a:
    MI->x86opsize = '\x04';
    SStream_concat0(O,"dword ptr ");
    goto LAB_001a288c;
  case 0x2b:
    SStream_concat0(O,"qword ptr ");
    MI->x86opsize = '\b';
LAB_001a288c:
    printMemReference(MI,1,O);
    SStream_concat0(O," {");
    printOperand(MI,6,O);
    pcVar15 = "}, ";
    goto LAB_001a28c2;
  case 0x2c:
    printOperand(MI,2,O);
    goto LAB_001a2b5c;
  default:
    goto switchD_001a2493_default;
  }
  printMemReference(MI,0,O);
LAB_001a28fa:
  pcVar15 = ", ";
  switch(uVar6 >> 0x14 & 0x1f) {
  case 1:
    break;
  case 2:
    SStream_concat0(O,", st(0)");
    reg_00 = 0x6a;
    goto LAB_001a2e8c;
  case 3:
    pcVar15 = "pd\t";
    goto LAB_001a2a27;
  case 4:
    pcVar15 = "ps\t";
    goto LAB_001a2a27;
  case 5:
    pcVar15 = "sd\t";
    goto LAB_001a2a27;
  case 6:
    pcVar15 = "ss\t";
LAB_001a2a27:
    SStream_concat0(O,pcVar15);
    uVar14 = 0;
    goto LAB_001a2ab9;
  case 7:
    SStream_concat0(O,":");
    goto switchD_001a2af0_caseD_18;
  case 8:
    SStream_concat0(O,", dx");
    reg_00 = 0x12;
    goto LAB_001a2e8c;
  case 9:
    SStream_concat0(O,", ax");
    reg_00 = 3;
    goto LAB_001a2e8c;
  case 10:
    SStream_concat0(O,", eax");
    reg_00 = 0x13;
    goto LAB_001a2e8c;
  case 0xb:
    SStream_concat0(O,", rax");
    reg_00 = 0x23;
    goto LAB_001a2e8c;
  case 0xc:
    SStream_concat0(O,", al");
    reg_00 = 2;
    goto LAB_001a2e8c;
  case 0xd:
    goto switchD_001a2925_caseD_d;
  case 0xe:
    SStream_concat0(O,", 1");
    op_addImm(MI,1);
  default:
    goto switchD_001a2493_default;
  case 0x10:
    pcVar15 = " {";
    break;
  case 0x11:
    pcVar15 = "pd \t";
    goto LAB_001a2a8a;
  case 0x12:
    pcVar15 = "ps \t";
    goto LAB_001a2a8a;
  case 0x13:
    pcVar15 = "}, ";
    break;
  case 0x14:
    pcVar15 = "d\t";
    goto LAB_001a2a8a;
  case 0x15:
    pcVar15 = "q\t";
    goto LAB_001a2a8a;
  case 0x16:
    pcVar15 = "ud\t";
    goto LAB_001a2a8a;
  case 0x17:
    pcVar15 = "uq\t";
LAB_001a2a8a:
    SStream_concat0(O,pcVar15);
    printOperand(MI,0,O);
    SStream_concat0(O,", ");
    uVar14 = 1;
LAB_001a2ab9:
    pcVar15 = ", ";
    printOperand(MI,uVar14,O);
  }
  SStream_concat0(O,pcVar15);
  switch(uVar6 >> 0x19 & 0x3f) {
  case 1:
    uVar14 = 2;
    goto LAB_001a2e36;
  case 2:
    uVar14 = 2;
    goto LAB_001a2d1a;
  case 3:
    uVar14 = 2;
    goto LAB_001a2d6e;
  case 4:
    uVar14 = 2;
    goto LAB_001a2d59;
  case 5:
    uVar14 = 2;
    goto LAB_001a2bee;
  case 6:
    uVar14 = 2;
    goto LAB_001a2cf0;
  case 7:
    printf64mem(MI,2,O);
    break;
  case 8:
    printf32mem(MI,2,O);
    break;
  case 9:
    uVar14 = 1;
LAB_001a2d6e:
    printi32mem(MI,uVar14,O);
    break;
  case 10:
    uVar14 = 1;
    goto LAB_001a2e36;
  case 0xb:
    uVar14 = 1;
LAB_001a2d59:
    printi64mem(MI,uVar14,O);
    break;
  case 0xc:
    uVar14 = 2;
    goto LAB_001a2c03;
  case 0xd:
    uVar14 = 1;
LAB_001a2c03:
    printi128mem(MI,uVar14,O);
    break;
  case 0xe:
    uVar14 = 1;
LAB_001a2d1a:
    printi16mem(MI,uVar14,O);
    break;
  case 0xf:
    uVar14 = 1;
LAB_001a2bee:
    printi8mem(MI,uVar14,O);
    break;
  case 0x10:
    uVar14 = 1;
LAB_001a2cf0:
    printf128mem(MI,uVar14,O);
    break;
  case 0x11:
    printf64mem(MI,1,O);
    goto switchD_001a2493_default;
  case 0x12:
    printf32mem(MI,1,O);
    goto switchD_001a2493_default;
  case 0x13:
    uVar6 = 1;
LAB_001a2d44:
    printopaquemem(MI,uVar6,O);
    goto switchD_001a2493_default;
  case 0x14:
    printSrcIdx8(MI,1,O);
    goto switchD_001a2493_default;
  case 0x15:
    printSrcIdx32(MI,1,O);
    goto switchD_001a2493_default;
  case 0x16:
    printSrcIdx64(MI,1,O);
    goto switchD_001a2493_default;
  case 0x17:
    printSrcIdx16(MI,1,O);
    goto switchD_001a2493_default;
  case 0x18:
switchD_001a2af0_caseD_18:
    uVar6 = 0;
    goto LAB_001a2b73;
  case 0x19:
    printi256mem(MI,1,O);
    break;
  case 0x1a:
    printf512mem(MI,2,O);
    SStream_concat0(O,", ");
    printAVXCC(MI,7,O);
    goto switchD_001a2493_default;
  case 0x1b:
    printi512mem(MI,1,O);
    break;
  case 0x1c:
    printf256mem(MI,1,O);
    break;
  case 0x1d:
    printf512mem(MI,1,O);
    break;
  case 0x1e:
    printi64mem(MI,3,O);
    goto LAB_001a2e00;
  case 0x1f:
    printOperand(MI,3,O);
    SStream_concat0(O,"}, ");
    break;
  case 0x20:
    printi32mem(MI,3,O);
LAB_001a2e00:
    SStream_concat0(O,", ");
    goto LAB_001a2e0f;
  case 0x21:
    uVar6 = 2;
    goto LAB_001a2da7;
  default:
    uVar14 = 5;
LAB_001a2e36:
    printOperand(MI,uVar14,O);
  }
  switch((uint)(CONCAT44(uVar7,uVar6) >> 0x1f) & 0xf) {
  case 1:
    pcVar15 = ", ";
    break;
  default:
    goto switchD_001a2493_default;
  case 3:
switchD_001a2925_caseD_d:
    SStream_concat0(O,", cl");
    reg_00 = 10;
LAB_001a2e8c:
    op_addReg(MI,reg_00);
    goto switchD_001a2493_default;
  case 4:
    pcVar15 = "}, ";
    break;
  case 5:
    SStream_concat0(O,"} {z}, ");
    op_addAvxZeroOpmask(MI);
    pSVar12 = extraout_RDX_04;
    goto LAB_001a2ebe;
  case 6:
    goto switchD_001a2e6a_caseD_6;
  case 7:
    SStream_concat0(O,"qword ptr ");
    MI->x86opsize = '\b';
    goto LAB_001a2f3b;
  case 8:
    MI->x86opsize = '\x04';
    SStream_concat0(O,"dword ptr ");
LAB_001a2f3b:
    uVar6 = 4;
LAB_001a2f43:
    printMemReference(MI,uVar6,O);
    goto switchD_001a2493_default;
  case 9:
    goto switchD_001a2e6a_caseD_9;
  case 10:
    goto switchD_001a2e6a_caseD_a;
  }
  SStream_concat0(O,pcVar15);
  pSVar12 = extraout_RDX_03;
LAB_001a2ebe:
  switch(uVar7 >> 3 & 0x1f) {
  case 1:
    printOperand(MI,2,O);
    switch(uVar7 >> 8 & 7) {
    default:
      break;
    case 1:
      goto switchD_001a3321_caseD_1;
    case 2:
      goto switchD_001a2e6a_caseD_a;
    case 3:
      goto switchD_001a2e6a_caseD_9;
    case 4:
      goto switchD_001a3321_caseD_4;
    case 5:
      goto switchD_001a3321_caseD_5;
    case 6:
switchD_001a2e6a_caseD_6:
      SStream_concat0(O,", {sae}");
      op_addAvxSae(MI);
      break;
    }
  case 2:
    printi32mem(MI,2,O);
    switch(uVar7 >> 8 & 7) {
    default:
      break;
    case 1:
      goto switchD_001a3321_caseD_1;
    case 2:
      goto switchD_001a2e6a_caseD_a;
    case 3:
      goto switchD_001a2e6a_caseD_9;
    case 4:
      goto switchD_001a3321_caseD_4;
    case 5:
      goto switchD_001a3321_caseD_5;
    case 6:
      goto switchD_001a2e6a_caseD_6;
    }
  case 3:
    printi64mem(MI,2,O);
    switch(uVar7 >> 8 & 7) {
    default:
      break;
    case 1:
      goto switchD_001a3321_caseD_1;
    case 2:
      goto switchD_001a2e6a_caseD_a;
    case 3:
      goto switchD_001a2e6a_caseD_9;
    case 4:
      goto switchD_001a3321_caseD_4;
    case 5:
      goto switchD_001a3321_caseD_5;
    case 6:
      goto switchD_001a2e6a_caseD_6;
    }
  case 4:
    goto switchD_001a2ee2_caseD_4;
  case 5:
    printOperand(MI,3,O);
    switch(uVar7 >> 8 & 7) {
    default:
      break;
    case 1:
      goto switchD_001a3321_caseD_1;
    case 2:
      goto switchD_001a2e6a_caseD_a;
    case 3:
      goto switchD_001a2e6a_caseD_9;
    case 4:
      goto switchD_001a3321_caseD_4;
    case 5:
      goto switchD_001a3321_caseD_5;
    case 6:
      goto switchD_001a2e6a_caseD_6;
    }
  case 6:
    printf64mem(MI,2,O);
    switch(uVar7 >> 8 & 7) {
    default:
      break;
    case 1:
      goto switchD_001a3321_caseD_1;
    case 2:
      goto switchD_001a2e6a_caseD_a;
    case 3:
      goto switchD_001a2e6a_caseD_9;
    case 4:
      goto switchD_001a3321_caseD_4;
    case 5:
      goto switchD_001a3321_caseD_5;
    case 6:
      goto switchD_001a2e6a_caseD_6;
    }
  case 7:
    printf32mem(MI,2,O);
    switch(uVar7 >> 8 & 7) {
    default:
      break;
    case 1:
      goto switchD_001a3321_caseD_1;
    case 2:
      goto switchD_001a2e6a_caseD_a;
    case 3:
      goto switchD_001a2e6a_caseD_9;
    case 4:
      goto switchD_001a3321_caseD_4;
    case 5:
      goto switchD_001a3321_caseD_5;
    case 6:
      goto switchD_001a2e6a_caseD_6;
    }
  case 8:
    printf256mem(MI,2,O);
    switch(uVar7 >> 8 & 7) {
    default:
      break;
    case 1:
      goto switchD_001a3321_caseD_1;
    case 2:
      goto switchD_001a2e6a_caseD_a;
    case 3:
      goto switchD_001a2e6a_caseD_9;
    case 4:
      goto switchD_001a3321_caseD_4;
    case 5:
      goto switchD_001a3321_caseD_5;
    case 6:
      goto switchD_001a2e6a_caseD_6;
    }
  case 9:
    printf512mem(MI,2,O);
    switch(uVar7 >> 8 & 7) {
    default:
      break;
    case 1:
      goto switchD_001a3321_caseD_1;
    case 2:
      goto switchD_001a2e6a_caseD_a;
    case 3:
      goto switchD_001a2e6a_caseD_9;
    case 4:
      goto switchD_001a3321_caseD_4;
    case 5:
      goto switchD_001a3321_caseD_5;
    case 6:
      goto switchD_001a2e6a_caseD_6;
    }
  case 10:
    printf128mem(MI,2,O);
    switch(uVar7 >> 8 & 7) {
    default:
      break;
    case 1:
      goto switchD_001a3321_caseD_1;
    case 2:
      goto switchD_001a2e6a_caseD_a;
    case 3:
      goto switchD_001a2e6a_caseD_9;
    case 4:
      goto switchD_001a3321_caseD_4;
    case 5:
      goto switchD_001a3321_caseD_5;
    case 6:
      goto switchD_001a2e6a_caseD_6;
    }
  case 0xb:
    printi128mem(MI,2,O);
    switch(uVar7 >> 8 & 7) {
    default:
      break;
    case 1:
      goto switchD_001a3321_caseD_1;
    case 2:
      goto switchD_001a2e6a_caseD_a;
    case 3:
      goto switchD_001a2e6a_caseD_9;
    case 4:
      goto switchD_001a3321_caseD_4;
    case 5:
      goto switchD_001a3321_caseD_5;
    case 6:
      goto switchD_001a2e6a_caseD_6;
    }
  case 0xc:
    printi512mem(MI,2,O);
    switch(uVar7 >> 8 & 7) {
    default:
      break;
    case 1:
      goto switchD_001a3321_caseD_1;
    case 2:
      goto switchD_001a2e6a_caseD_a;
    case 3:
      goto switchD_001a2e6a_caseD_9;
    case 4:
      goto switchD_001a3321_caseD_4;
    case 5:
      goto switchD_001a3321_caseD_5;
    case 6:
      goto switchD_001a2e6a_caseD_6;
    }
  case 0xd:
    printi256mem(MI,2,O);
    switch(uVar7 >> 8 & 7) {
    default:
      break;
    case 1:
      goto switchD_001a3321_caseD_1;
    case 2:
      goto switchD_001a2e6a_caseD_a;
    case 3:
      goto switchD_001a2e6a_caseD_9;
    case 4:
      goto switchD_001a3321_caseD_4;
    case 5:
      goto switchD_001a3321_caseD_5;
    case 6:
      goto switchD_001a2e6a_caseD_6;
    }
  case 0xe:
    printRoundingControl(MI,(uint)O,pSVar12);
    break;
  case 0xf:
switchD_001a2ee2_caseD_f:
    printf512mem(MI,3,O);
    break;
  case 0x10:
    printf64mem(MI,3,O);
    switch(uVar7 >> 8 & 7) {
    default:
      break;
    case 1:
      goto switchD_001a3321_caseD_1;
    case 2:
      goto switchD_001a2e6a_caseD_a;
    case 3:
      goto switchD_001a2e6a_caseD_9;
    case 4:
      goto switchD_001a3321_caseD_4;
    case 5:
      goto switchD_001a3321_caseD_5;
    case 6:
      goto switchD_001a2e6a_caseD_6;
    }
  case 0x11:
    printf32mem(MI,3,O);
    switch(uVar7 >> 8 & 7) {
    default:
      break;
    case 1:
      goto switchD_001a3321_caseD_1;
    case 2:
      goto switchD_001a2e6a_caseD_a;
    case 3:
      goto switchD_001a2e6a_caseD_9;
    case 4:
      goto switchD_001a3321_caseD_4;
    case 5:
      goto switchD_001a3321_caseD_5;
    case 6:
      goto switchD_001a2e6a_caseD_6;
    }
  case 0x12:
    printf128mem(MI,3,O);
    break;
  case 0x13:
    printf256mem(MI,3,O);
    break;
  case 0x14:
switchD_001a2ee2_caseD_14:
    printi128mem(MI,3,O);
    break;
  case 0x15:
switchD_001a2ee2_caseD_15:
    printi256mem(MI,3,O);
    break;
  case 0x16:
    uVar6 = 3;
LAB_001a2da7:
    printi512mem(MI,uVar6,O);
    break;
  case 0x17:
    uVar6 = 3;
LAB_001a3296:
    printi32mem(MI,uVar6,O);
    goto switchD_001a2e6a_caseD_9;
  case 0x18:
    uVar6 = 3;
LAB_001a32d4:
    printi64mem(MI,uVar6,O);
switchD_001a2e6a_caseD_a:
    SStream_concat0(O,"{1to8}");
    v = X86_AVX_BCAST_8;
LAB_001a32f3:
    op_addAvxBroadcast(MI,v);
    break;
  case 0x19:
    printi8mem(MI,2,O);
    goto LAB_001a3118;
  case 0x1a:
    printi16mem(MI,2,O);
LAB_001a3118:
    pcVar15 = ", ";
LAB_001a28c2:
    SStream_concat0(O,pcVar15);
switchD_001a2ee2_caseD_4:
    uVar6 = 7;
    goto LAB_001a2b73;
  default:
    printOperand(MI,6,O);
    switch(uVar7 >> 8 & 7) {
    default:
      break;
    case 1:
      goto switchD_001a3321_caseD_1;
    case 2:
      goto switchD_001a2e6a_caseD_a;
    case 3:
      goto switchD_001a2e6a_caseD_9;
    case 4:
      goto switchD_001a3321_caseD_4;
    case 5:
      goto switchD_001a3321_caseD_5;
    case 6:
      goto switchD_001a2e6a_caseD_6;
    }
  }
switchD_001a2493_default:
  uVar6 = MCInst_getOpcode(MI);
  xVar8 = X86_insn_reg_intel(uVar6);
  uVar17 = (ulong)xVar8;
  if (MI->csh->detail != CS_OPT_OFF) {
    local_38._4_4_ = xVar8;
    if (xVar8 == X86_REG_INVALID) {
      uVar6 = MCInst_getOpcode(MI);
      _Var5 = X86_insn_reg_intel2(uVar6,(x86_reg *)((long)&local_38 + 4),(x86_reg *)&local_38);
      uVar17 = (ulong)local_38._4_4_;
      if (_Var5) {
        (MI->flat_insn->detail->field_6).x86.operands[0].type = X86_OP_REG;
        (MI->flat_insn->detail->field_6).x86.operands[0].field_1.reg = local_38._4_4_;
        *(uint8_t *)((long)&MI->flat_insn->detail->field_6 + 0x50) = MI->csh->regsize_map[uVar17];
        (MI->flat_insn->detail->field_6).x86.operands[1].type = X86_OP_REG;
        (MI->flat_insn->detail->field_6).x86.operands[1].field_1.reg = (x86_reg)local_38;
        *(uint8_t *)((long)&MI->flat_insn->detail->field_6 + 0x80) =
             MI->csh->regsize_map[(x86_reg)local_38];
        (MI->flat_insn->detail->field_6).x86.op_count = '\x02';
      }
    }
    else {
      pcVar4 = MI->flat_insn->detail;
      memmove((void *)((long)&pcVar4->field_6 + 0x60),(void *)((long)&pcVar4->field_6 + 0x30),0x150)
      ;
      (MI->flat_insn->detail->field_6).x86.operands[0].type = X86_OP_REG;
      (MI->flat_insn->detail->field_6).x86.operands[0].field_1.reg = xVar8;
      *(uint8_t *)((long)&MI->flat_insn->detail->field_6 + 0x50) = MI->csh->regsize_map[xVar8];
      puVar1 = &(MI->flat_insn->detail->field_6).x86.op_count;
      *puVar1 = *puVar1 + '\x01';
    }
  }
  if ((int)uVar17 != 0 && MI->op1_size == '\0') {
    MI->op1_size = MI->csh->regsize_map[uVar17];
  }
  return;
switchD_001a3321_caseD_1:
  SStream_concat0(O,", ");
  switch(uVar7 >> 0xb & 0xf) {
  case 0:
    uVar6 = 4;
    goto LAB_001a35e2;
  case 1:
    uVar6 = 7;
    goto LAB_001a35e2;
  case 2:
    printf64mem(MI,3,O);
    break;
  case 3:
    goto switchD_001a2ee2_caseD_f;
  case 4:
    uVar6 = 3;
LAB_001a35e2:
    printOperand(MI,uVar6,O);
    break;
  case 5:
    printf32mem(MI,3,O);
    break;
  case 6:
    printf128mem(MI,3,O);
    break;
  case 7:
    printf256mem(MI,3,O);
    break;
  case 8:
    uVar6 = 4;
    goto LAB_001a3296;
  case 9:
    printi32mem(MI,3,O);
    break;
  case 10:
    uVar6 = 4;
    goto LAB_001a2da7;
  case 0xb:
    printi512mem(MI,3,O);
    break;
  case 0xc:
    uVar6 = 4;
    goto LAB_001a32d4;
  case 0xd:
    printi64mem(MI,3,O);
    break;
  case 0xe:
    goto switchD_001a2ee2_caseD_14;
  case 0xf:
    goto switchD_001a2ee2_caseD_15;
  }
  switch(uVar7 >> 0xf & 7) {
  case 1:
    SStream_concat0(O,", ");
    uVar6 = uVar7 >> 0x12 & 3;
    if (uVar6 == 1) {
      uVar6 = 5;
    }
    else if (uVar6 == 2) {
      uVar6 = 4;
    }
    else {
LAB_001a2e0f:
      uVar6 = 8;
    }
LAB_001a2b73:
    printOperand(MI,uVar6,O);
    goto switchD_001a2493_default;
  case 2:
    goto switchD_001a2e6a_caseD_a;
  case 3:
switchD_001a2e6a_caseD_9:
    SStream_concat0(O,"{1to16}");
    v = X86_AVX_BCAST_16;
    break;
  case 4:
switchD_001a3321_caseD_4:
    SStream_concat0(O,"{1to4}");
    v = X86_AVX_BCAST_4;
    break;
  case 5:
switchD_001a3321_caseD_5:
    SStream_concat0(O,"{1to2}");
    v = X86_AVX_BCAST_2;
    break;
  default:
    goto switchD_001a2493_default;
  }
  goto LAB_001a32f3;
}

Assistant:

void X86_Intel_printInst(MCInst *MI, SStream *O, void *Info)
{
	char *mnem;
	x86_reg reg, reg2;

	// Try to print any aliases first.
	mnem = printAliasInstr(MI, O, Info);
	if (mnem)
		cs_mem_free(mnem);
	else
		printInstruction(MI, O, Info);

	reg = X86_insn_reg_intel(MCInst_getOpcode(MI));
	if (MI->csh->detail) {
		// first op can be embedded in the asm by llvm.
		// so we have to add the missing register as the first operand
		if (reg) {
			// shift all the ops right to leave 1st slot for this new register op
			memmove(&(MI->flat_insn->detail->x86.operands[1]), &(MI->flat_insn->detail->x86.operands[0]),
					sizeof(MI->flat_insn->detail->x86.operands[0]) * (ARR_SIZE(MI->flat_insn->detail->x86.operands) - 1));
			MI->flat_insn->detail->x86.operands[0].type = X86_OP_REG;
			MI->flat_insn->detail->x86.operands[0].reg = reg;
			MI->flat_insn->detail->x86.operands[0].size = MI->csh->regsize_map[reg];
			MI->flat_insn->detail->x86.op_count++;
		} else {
			if (X86_insn_reg_intel2(MCInst_getOpcode(MI), &reg, &reg2)) {
				MI->flat_insn->detail->x86.operands[0].type = X86_OP_REG;
				MI->flat_insn->detail->x86.operands[0].reg = reg;
				MI->flat_insn->detail->x86.operands[0].size = MI->csh->regsize_map[reg];
				MI->flat_insn->detail->x86.operands[1].type = X86_OP_REG;
				MI->flat_insn->detail->x86.operands[1].reg = reg2;
				MI->flat_insn->detail->x86.operands[1].size = MI->csh->regsize_map[reg2];
				MI->flat_insn->detail->x86.op_count = 2;
			}
		}
	}

	if (MI->op1_size == 0 && reg)
		MI->op1_size = MI->csh->regsize_map[reg];
}